

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::api::json::DecodePsbtInput::DecodePsbtInput(DecodePsbtInput *this)

{
  JsonClassBase<cfd::api::json::DecodePsbtInput> *in_RDI;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *in_stack_ffffffffffffff70;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this_00;
  DecodePsbtUtxo *in_stack_ffffffffffffff90;
  DecodeUnlockingScript *this_01;
  DecodeRawTransactionResponse *this_02;
  allocator local_1d [20];
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::DecodePsbtInput>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodePsbtInput_009f8a90;
  this_02 = (DecodeRawTransactionResponse *)(in_RDI + 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x66319e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(this_02);
  this_01 = (DecodeUnlockingScript *)(in_RDI + 0x25);
  DecodePsbtUtxo::DecodePsbtUtxo(in_stack_ffffffffffffff90);
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  JsonObjectVector((JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *)
                   in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x48),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  PsbtScriptData::PsbtScriptData((PsbtScriptData *)this_02);
  PsbtScriptData::PsbtScriptData((PsbtScriptData *)this_02);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::JsonObjectVector
            (in_stack_ffffffffffffff70);
  DecodeUnlockingScript::DecodeUnlockingScript(this_01);
  this_00 = (JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *)(in_RDI + 0x85);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::JsonObjectVector(this_00);
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtInput() {
    CollectFieldName();
  }